

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2chords.cpp
# Opt level: O0

void printChordSequence(vector<Sonority,_std::allocator<Sonority>_> *chordSequence)

{
  size_type sVar1;
  reference pvVar2;
  ostream *poVar3;
  int local_1c;
  int i;
  vector<Sonority,_std::allocator<Sonority>_> *cs;
  vector<Sonority,_std::allocator<Sonority>_> *chordSequence_local;
  
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<Sonority,_std::allocator<Sonority>_>::size(chordSequence);
    if ((int)sVar1 <= local_1c) break;
    pvVar2 = std::vector<Sonority,_std::allocator<Sonority>_>::operator[]
                       (chordSequence,(long)local_1c);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,pvVar2->qstamp);
    poVar3 = std::operator<<(poVar3,"\t");
    pvVar2 = std::vector<Sonority,_std::allocator<Sonority>_>::operator[]
                       (chordSequence,(long)local_1c);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar2->qdur);
    std::operator<<(poVar3,":\t");
    pvVar2 = std::vector<Sonority,_std::allocator<Sonority>_>::operator[]
                       (chordSequence,(long)local_1c);
    printPcInfo(pvVar2);
    poVar3 = std::operator<<((ostream *)&std::cout,":\t");
    pvVar2 = std::vector<Sonority,_std::allocator<Sonority>_>::operator[]
                       (chordSequence,(long)local_1c);
    std::operator<<(poVar3,(string *)&pvVar2->root);
    poVar3 = std::operator<<((ostream *)&std::cout,"\t");
    pvVar2 = std::vector<Sonority,_std::allocator<Sonority>_>::operator[]
                       (chordSequence,(long)local_1c);
    std::operator<<(poVar3,(string *)&pvVar2->quality);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void printChordSequence(vector<Sonority>& chordSequence) {
	vector<Sonority>& cs = chordSequence;
	for (int i=0; i<(int)cs.size(); i++) {
		cout << cs[i].qstamp << "\t" << cs[i].qdur << ":\t";
		printPcInfo(cs[i]);
		cout << ":\t" << cs[i].root;
		cout << "\t" << cs[i].quality;
		cout << endl;
	}
}